

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

Clifford * operator*(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  pointer *ppBVar1;
  uint uVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  iterator __position;
  float *pfVar6;
  pointer pBVar7;
  pointer pBVar8;
  long lVar9;
  uint uVar10;
  float fVar11;
  Blade local_30;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (long)dim) {
    memset(Re,0,(long)dim << 2);
  }
  pBVar7 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar3 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pBVar7 != pBVar3) {
    pBVar4 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar5 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    do {
      pfVar6 = Re;
      if (pBVar4 != pBVar5) {
        uVar2 = pBVar7->mBase;
        pBVar8 = pBVar4;
        do {
          fVar11 = pBVar7->mVal * pBVar8->mVal;
          if (1e-06 < ABS(fVar11)) {
            uVar10 = pBVar8->mBase ^ uVar2;
            pfVar6[(int)uVar10] =
                 (float)signs[(int)uVar2][pBVar8->mBase] * fVar11 + pfVar6[(int)uVar10];
          }
          pBVar8 = pBVar8 + 1;
        } while (pBVar8 != pBVar5);
      }
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar3);
  }
  if (0 < dim) {
    lVar9 = 0;
    do {
      if (1e-06 < ABS(Re[lVar9])) {
        Blade::Blade(&local_30,(int)lVar9,Re[lVar9]);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,__position,&local_30);
        }
        else {
          *__position._M_current = local_30;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_30);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < dim);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator*(Clifford A, Clifford B)
{
    Clifford R; 
	for(int i=0;i<dim;i++)Re[i]=0;

    idx a=A.begin();
	while(a!=A.end())
	{	
		int am=a->mBase;
		idx b=B.begin();
		while(b!=B.end())
		{	
			int bm=b->mBase;
			float prd=(a->mVal)*(b->mVal);
			if(fabs(prd)>Error2)
			{
				Re[am^bm]+=signs[am][bm]*prd;
			}
			b++;
		}
		a++;
	}

    
	for(int i=0;i<dim;i++)
	{if(fabs(Re[i])>Error2){R.push_back(Blade(i,Re[i]));}}
	
	//delete Re;
	return R;
}